

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int iVar2;
  stbi_uc *psVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  
  iVar1 = stbi__pic_is4(s,anon_var_dwarf_41ea2);
  if (iVar1 == 0) goto LAB_00121493;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar3 = s->img_buffer;
LAB_00121413:
    s->img_buffer = psVar3 + 0x58;
  }
  else {
    psVar3 = s->img_buffer;
    iVar1 = (int)s->img_buffer_end - (int)psVar3;
    if (0x57 < iVar1) goto LAB_00121413;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar1);
  }
  iVar1 = stbi__get16be(s);
  if (x != (int *)0x0) {
    *x = iVar1;
  }
  iVar2 = stbi__get16be(s);
  if (y != (int *)0x0) {
    *y = iVar2;
    iVar2 = iVar1;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012145f:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00121493;
  }
  else {
    iVar1 = (*(s->io).eof)(s->io_user_data);
    if (iVar1 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_00121493;
      goto LAB_0012145f;
    }
  }
  iVar1 = iVar2;
  if (x != (int *)0x0) {
    iVar1 = *x;
  }
  if (iVar1 != 0) {
    if (y != (int *)0x0) {
      iVar2 = *y;
    }
    if ((int)(0x10000000 / (long)iVar1) < iVar2) {
LAB_00121493:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar3 = s->img_buffer;
  }
  else {
    psVar3 = s->img_buffer;
    iVar1 = (int)s->img_buffer_end - (int)psVar3;
    if (iVar1 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar1);
      goto LAB_001214fc;
    }
  }
  s->img_buffer = psVar3 + 8;
LAB_001214fc:
  iVar1 = 0xb;
  bVar7 = 0;
  do {
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      return 0;
    }
    pbVar4 = s->img_buffer;
    pbVar5 = s->img_buffer_end;
    if (pbVar4 < pbVar5) {
LAB_0012153e:
      s->img_buffer = pbVar4 + 1;
      bVar8 = *pbVar4 == 0;
      pbVar4 = pbVar4 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar4 = s->img_buffer;
        pbVar5 = s->img_buffer_end;
        goto LAB_0012153e;
      }
      bVar8 = true;
    }
    if (pbVar4 < pbVar5) {
LAB_00121579:
      s->img_buffer = pbVar4 + 1;
      bVar9 = *pbVar4 == 8;
      pbVar4 = pbVar4 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar4 = s->img_buffer;
        pbVar5 = s->img_buffer_end;
        goto LAB_00121579;
      }
      bVar9 = false;
    }
    if (pbVar4 < pbVar5) {
LAB_001215af:
      pbVar4 = pbVar4 + 1;
      s->img_buffer = pbVar4;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      pbVar5 = s->img_buffer_end;
      goto LAB_001215af;
    }
    if (pbVar4 < pbVar5) {
LAB_001215d4:
      s->img_buffer = pbVar4 + 1;
      bVar6 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar4 = s->img_buffer;
        goto LAB_001215d4;
      }
      bVar6 = 0;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012160a:
      if (s->img_buffer_end <= pbVar4) goto LAB_00121493;
    }
    else {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 != 0) {
        if (s->read_from_callbacks != 0) {
          pbVar4 = s->img_buffer;
          goto LAB_0012160a;
        }
        goto LAB_00121493;
      }
    }
    if (!bVar9) goto LAB_00121493;
    bVar7 = bVar7 | bVar6;
    if (bVar8) {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar7 & 0x10) == 0);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}